

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * index2adr(lua_State *L,int idx)

{
  ulong uVar1;
  lua_State *local_120;
  TValue *local_118;
  TValue *o_2;
  GCfunc *fn;
  TValue *o_1;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 1) {
    if (idx < -9999) {
      if (idx == -0x2712) {
        L_local = (lua_State *)((L->glref).ptr64 + 0xe8);
        (L_local->nextgc).gcptr64 = (L->env).gcptr64 | 0xfffa000000000000;
      }
      else if (idx == -10000) {
        L_local = (lua_State *)((L->glref).ptr64 + 0x110);
      }
      else {
        uVar1 = L->base[-2].u64 & 0x7fffffffffff;
        if (idx == -0x2711) {
          L_local = (lua_State *)((L->glref).ptr64 + 0xe8);
          (L_local->nextgc).gcptr64 = *(ulong *)(uVar1 + 0x10) | 0xfffa000000000000;
        }
        else {
          if ((int)(uint)*(byte *)(uVar1 + 0xb) < -idx + -0x2712) {
            local_120 = (lua_State *)((L->glref).ptr64 + 0xf8);
          }
          else {
            local_120 = (lua_State *)(uVar1 + 0x30 + (long)(-idx + -0x2713) * 8);
          }
          L_local = local_120;
        }
      }
    }
    else {
      L_local = (lua_State *)(L->top + idx);
    }
  }
  else {
    local_118 = L->base + (idx + -1);
    if (L->top <= local_118) {
      local_118 = (TValue *)((L->glref).ptr64 + 0xf8);
    }
    L_local = (lua_State *)&local_118->gcr;
  }
  return (TValue *)L_local;
}

Assistant:

static TValue *index2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else if (idx > LUA_REGISTRYINDEX) {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"bad stack slot %d", idx);
    return L->top + idx;
  } else if (idx == LUA_GLOBALSINDEX) {
    TValue *o = &G(L)->tmptv;
    settabV(L, o, tabref(L->env));
    return o;
  } else if (idx == LUA_REGISTRYINDEX) {
    return registry(L);
  } else {
    GCfunc *fn = curr_func(L);
    lj_checkapi(fn->c.gct == ~LJ_TFUNC && !isluafunc(fn),
		"calling frame is not a C function");
    if (idx == LUA_ENVIRONINDEX) {
      TValue *o = &G(L)->tmptv;
      settabV(L, o, tabref(fn->c.env));
      return o;
    } else {
      idx = LUA_GLOBALSINDEX - idx;
      return idx <= fn->c.nupvalues ? &fn->c.upvalue[idx-1] : niltv(L);
    }
  }
}